

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNSparseMatrix_Reallocate(SUNMatrix A,sunindextype NNZ)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar2 = realloc(*(void **)((long)A->content + 0x30),NNZ * 8);
  pvVar1 = A->content;
  *(void **)((long)pvVar1 + 0x30) = pvVar2;
  pvVar2 = realloc(*(void **)((long)pvVar1 + 0x20),NNZ * 8);
  pvVar1 = A->content;
  *(void **)((long)pvVar1 + 0x20) = pvVar2;
  *(sunindextype *)((long)pvVar1 + 0x10) = NNZ;
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_Reallocate(SUNMatrix A, sunindextype NNZ)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(NNZ >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype*)realloc(SM_INDEXVALS_S(A),
                                             NNZ * sizeof(sunindextype));
  SUNAssert(SM_INDEXVALS_S(A), SUN_ERR_MALLOC_FAIL);

  SM_DATA_S(A) = (sunrealtype*)realloc(SM_DATA_S(A), NNZ * sizeof(sunrealtype));
  SUNAssert(SM_DATA_S(A), SUN_ERR_MALLOC_FAIL);

  SM_NNZ_S(A) = NNZ;

  return SUN_SUCCESS;
}